

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

void sesschan_check_close_callback(void *vctx)

{
  sesschan *sess;
  void *vctx_local;
  
  if (((*(byte *)((long)vctx + 0x561) & 1) != 0) && ((*(byte *)((long)vctx + 0x562) & 1) != 0)) {
    sshfwd_initiate_close(*vctx,(char *)0x0);
  }
  return;
}

Assistant:

static void sesschan_check_close_callback(void *vctx)
{
    sesschan *sess = (sesschan *)vctx;

    /*
     * Once we've seen incoming EOF from the backend (aka EIO from the
     * pty master) and also passed on the process's exit status, we
     * should proactively initiate closure of the session channel.
     */
    if (sess->seen_eof && sess->seen_exit)
        sshfwd_initiate_close(sess->c, NULL);
}